

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::BuildWrapMesh(TPZMHMeshControl *this,int dim)

{
  uint uVar1;
  long lVar2;
  TPZGeoEl *pTVar3;
  TPZGeoMesh *pTVar4;
  int iVar5;
  int iVar6;
  TPZGeoEl **ppTVar7;
  ostream *this_00;
  long *plVar8;
  int iVar9;
  long nelem;
  int64_t iVar10;
  TPZGeoElSide gelside;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide neighbour;
  ofstream outvtk;
  TPZAutoPointer<TPZGeoMesh> local_510;
  int local_508;
  int local_504;
  TPZGeoElSide local_500;
  undefined1 local_4e8 [8];
  TPZGeoEl *local_4e0;
  int local_4d8;
  int64_t local_4d0;
  undefined1 *local_4c8;
  TPZGeoElSide local_4c0;
  TPZGeoElSide local_4a8;
  TPZGeoElSide local_490;
  TPZGeoElSide local_478;
  TPZGeoElSide local_460;
  TPZGeoElSide local_448;
  undefined **local_430;
  TPZGeoEl *local_428;
  int local_420;
  undefined **local_230;
  TPZGeoEl *local_228;
  int local_220;
  undefined1 auStack_138 [264];
  
  lVar2 = (((this->fGMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.
          fNElements;
  if (0 < lVar2) {
    iVar10 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,iVar10);
      pTVar3 = *ppTVar7;
      if (pTVar3 != (TPZGeoEl *)0x0) {
        iVar5 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
        if (iVar5 == dim) {
          iVar5 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
          if (0 < iVar5) {
            iVar9 = 0;
            do {
              iVar6 = (**(code **)(*(long *)pTVar3 + 0x208))(pTVar3,iVar9);
              if (iVar6 == dim + -1) {
                (**(code **)(*(long *)pTVar3 + 0x188))(&local_430,pTVar3,iVar9);
                while ((local_428 != pTVar3 || (local_420 != iVar9))) {
                  if (local_428->fMatId == this->fBoundaryWrapMatId) {
                    local_478.super_TPZSavable._vptr_TPZSavable =
                         (_func_int **)&PTR__TPZGeoElSide_01920090;
                    local_478.fGeoEl = pTVar3;
                    local_478.fSide = iVar9;
                    iVar6 = HasWrapNeighbour(this,&local_478);
                    if (iVar6 != this->fBoundaryWrapMatId && iVar6 != 0) {
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                                 ,0x8d7);
                    }
                    local_490.super_TPZSavable._vptr_TPZSavable =
                         (_func_int **)&PTR__TPZGeoElSide_01920090;
                    local_490.fGeoEl = pTVar3;
                    local_490.fSide = iVar9;
                    CreateWrap(this,&local_490,this->fBoundaryWrapMatId);
                  }
                  if (local_428 == (TPZGeoEl *)0x0) {
                    local_230 = &PTR__TPZGeoElSide_01920090;
                    local_228 = (TPZGeoEl *)0x0;
                    local_220 = -1;
                  }
                  else {
                    (**(code **)(*(long *)local_428 + 0x188))(&local_230,local_428,local_420);
                  }
                  local_428 = local_228;
                  local_420 = local_220;
                }
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != iVar5);
          }
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != lVar2);
  }
  if (0 < lVar2) {
    local_508 = dim + -1;
    local_4c8 = auStack_138;
    iVar10 = 0;
    do {
      local_4d0 = iVar10;
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,iVar10);
      pTVar3 = *ppTVar7;
      if (pTVar3 != (TPZGeoEl *)0x0) {
        iVar5 = (**(code **)(*(long *)pTVar3 + 0x210))();
        if (iVar5 == dim) {
          local_504 = (**(code **)(*(long *)pTVar3 + 0xf0))();
          if (0 < local_504) {
            iVar5 = 0;
            do {
              iVar9 = (**(code **)(*(long *)pTVar3 + 0x208))(pTVar3,iVar5);
              if (iVar9 == local_508) {
                local_500.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_01920090;
                local_500.fGeoEl = pTVar3;
                local_500.fSide = iVar5;
                (**(code **)(*(long *)pTVar3 + 0x188))(local_4e8,pTVar3,iVar5);
                while ((local_4e0 != local_500.fGeoEl || (local_4d8 != local_500.fSide))) {
                  uVar1 = local_4e0->fMatId;
                  iVar9 = (*this->_vptr_TPZMHMeshControl[9])(this,(ulong)uVar1);
                  if ((char)iVar9 != '\0') {
                    local_448.super_TPZSavable._vptr_TPZSavable =
                         (_func_int **)&PTR__TPZGeoElSide_01920090;
                    local_448.fSide = local_500.fSide;
                    local_448.fGeoEl = local_500.fGeoEl;
                    iVar9 = HasWrapNeighbour(this,&local_448);
                    if (((iVar9 != 0) && (iVar9 != this->fSkeletonWrapMatId)) &&
                       (iVar9 != this->fBoundaryWrapMatId)) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"neighbour is skeleton with matid ",0x21);
                      this_00 = (ostream *)std::ostream::operator<<(&std::cout,uVar1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (this_00," but the element has a wrap neighbour with matid ",0x31);
                      plVar8 = (long *)std::ostream::operator<<(this_00,iVar9);
                      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                      std::ostream::put((char)plVar8);
                      std::ostream::flush();
                      TPZGeoElSide::Print(&local_500,(ostream *)&std::cout);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                      std::ostream::put(-0x58);
                      std::ostream::flush();
                      (**(code **)(*(long *)local_500.fGeoEl + 0x1a0))(local_500.fGeoEl,&std::cout);
                      std::ofstream::ofstream(&local_430,"gmesh.txt",_S_out);
                      pTVar4 = ((this->fGMesh).fRef)->fPointer;
                      (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[9])(pTVar4,&local_430);
                      std::ofstream::ofstream((ofstream *)&local_230,"gmesh.vtk",_S_out);
                      local_510.fRef = (this->fGMesh).fRef;
                      LOCK();
                      ((local_510.fRef)->fCounter).super___atomic_base<int>._M_i =
                           ((local_510.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                      TPZVTKGeoMesh::PrintGMeshVTK
                                ((local_510.fRef)->fPointer,(ofstream *)&local_230,true,false);
                      TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(&local_510);
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                                 ,0x8fd);
                    }
                    if (iVar9 == 0) {
                      local_460.super_TPZSavable._vptr_TPZSavable =
                           (_func_int **)&PTR__TPZGeoElSide_01920090;
                      local_460.fSide = local_4d8;
                      local_460.fGeoEl = local_4e0;
                      CreateWrap(this,&local_460,this->fSkeletonWrapMatId);
                    }
                  }
                  if (local_4e0 == (TPZGeoEl *)0x0) {
                    local_430 = &PTR__TPZGeoElSide_01920090;
                    local_428 = (TPZGeoEl *)0x0;
                    local_420 = -1;
                  }
                  else {
                    (**(code **)(*(long *)local_4e0 + 0x188))(&local_430,local_4e0,local_4d8);
                  }
                  local_4e0 = local_428;
                  local_4d8 = local_420;
                }
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 != local_504);
          }
        }
      }
      iVar10 = local_4d0 + 1;
    } while (iVar10 != lVar2);
  }
  if (0 < lVar2) {
    nelem = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
      pTVar3 = *ppTVar7;
      if (pTVar3 != (TPZGeoEl *)0x0) {
        iVar5 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
        if (iVar5 == dim) {
          iVar5 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
          if (0 < iVar5) {
            iVar9 = 0;
            do {
              iVar6 = (**(code **)(*(long *)pTVar3 + 0x208))(pTVar3,iVar9);
              if (iVar6 == dim + -1) {
                local_4a8.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_01920090;
                local_4a8.fGeoEl = pTVar3;
                local_4a8.fSide = iVar9;
                iVar6 = HasWrapNeighbour(this,&local_4a8);
                if (iVar6 == 0) {
                  local_4c0.super_TPZSavable._vptr_TPZSavable =
                       (_func_int **)&PTR__TPZGeoElSide_01920090;
                  local_4c0.fGeoEl = pTVar3;
                  local_4c0.fSide = iVar9;
                  CreateWrap(this,&local_4c0);
                }
              }
              iVar9 = iVar9 + 1;
            } while (iVar5 != iVar9);
          }
        }
      }
      nelem = nelem + 1;
    } while (nelem != lVar2);
  }
  return;
}

Assistant:

void TPZMHMeshControl::BuildWrapMesh(int dim)
{
    // all the elements should be neighbour of a wrap element
    int64_t nel = fGMesh->NElements();
  
//    int meshdim = fGMesh->Dimension();
// first create the neighbours of boundary elements (works for dim = fGMesh->Dimension()-2)
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->MaterialId() == fBoundaryWrapMatId) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fBoundaryWrapMatId) {
                        DebugStop();
                    }
                    else
                    {
                        CreateWrap(gelside,fBoundaryWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    // create the wrap elements around the skeleton elements
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                int neighmatid = neighbour.Element()->MaterialId();
                if (IsSkeletonMatid(neighmatid)) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fSkeletonWrapMatId && wrapmat != fBoundaryWrapMatId) {
                        std::cout << "neighbour is skeleton with matid " << neighmatid <<
                        " but the element has a wrap neighbour with matid " << wrapmat << std::endl;
                        gelside.Print(std::cout);
                        std::cout << std::endl;
                        gelside.Element()->Print(std::cout);
                        std::ofstream out("gmesh.txt");
                        fGMesh->Print(out);
                        std::ofstream outvtk("gmesh.vtk");
                        TPZVTKGeoMesh::PrintGMeshVTK(fGMesh,outvtk);
                        DebugStop();
                    }
                    else if(!wrapmat)
                    {
                        CreateWrap(neighbour,fSkeletonWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            if (!HasWrapNeighbour(gelside)) {
                CreateWrap(gelside);
            }
        }
    }
}